

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::AutomakeReporter::skipTest(AutomakeReporter *this,TestCaseInfo *testInfo)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           ":test-result: SKIP ");
  poVar1 = std::operator<<(poVar1,(string *)testInfo);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void AutomakeReporter::skipTest(TestCaseInfo const& testInfo) {
        m_stream << ":test-result: SKIP " << testInfo.name << '\n';
    }